

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.h
# Opt level: O2

void __thiscall
kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded
          (ExternalMutexGuarded<capnp::compiler::BrandedDecl> *this)

{
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_h:449:7)>
  _kjDefer449;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_h:449:7)>
  local_d8;
  undefined1 local_c8;
  BrandedDecl local_b8;
  
  if (this->mutex != (Mutex *)0x0) {
    local_c8 = 0;
    kj::_::Mutex::lock(this->mutex,0);
    local_d8.maybeFunc.ptr.isSet = true;
    local_b8.body.tag = 0;
    local_b8.source._reader.data = (void *)0x0;
    local_b8.source._reader.pointers._0_6_ = 0;
    local_b8.source._reader.pointers._6_2_ = 0;
    local_b8.source._reader.dataSize = 0;
    local_b8.source._reader.pointerCount = 0;
    local_b8.brand.disposer = (Disposer *)0x0;
    local_b8.brand.ptr = (BrandScope *)0x0;
    local_b8.source._reader.segment = (SegmentReader *)0x0;
    local_b8.source._reader.capTable = (CapTableReader *)0x0;
    local_b8.source._reader.nestingLimit = 0x7fffffff;
    local_d8.maybeFunc.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_h:449:7)>_2
          )this;
    capnp::compiler::BrandedDecl::operator=(&this->value,&local_b8);
    capnp::compiler::BrandedDecl::~BrandedDecl(&local_b8);
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.h:449:7)>
    ::run(&local_d8);
  }
  capnp::compiler::BrandedDecl::~BrandedDecl(&this->value);
  return;
}

Assistant:

~ExternalMutexGuarded() noexcept(false) {
    if (mutex != nullptr) {
      mutex->lock(_::Mutex::EXCLUSIVE, kj::none, location);
      KJ_DEFER(mutex->unlock(_::Mutex::EXCLUSIVE));
      value = T();
    }
  }